

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O2

Expression __thiscall
cnn::FastLSTMBuilder::add_input_impl(FastLSTMBuilder *this,int prev,Expression *x)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 *in_RCX;
  long *plVar4;
  long *plVar5;
  long lVar6;
  undefined4 in_register_00000034;
  long lVar7;
  VariableIndex VVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  Expression EVar12;
  Expression i_aot;
  Expression i_ot;
  Expression i_it;
  Expression ph_t;
  Expression i_wt;
  Expression i_ft;
  undefined1 local_1a8 [8];
  ulong local_1a0;
  long local_198;
  undefined1 local_190 [16];
  pointer local_180;
  undefined4 local_178;
  ComputationGraph *local_170;
  uint local_168;
  ExecutionEngine *local_160;
  undefined4 local_158;
  undefined8 local_150;
  undefined4 local_148;
  uint local_13c;
  undefined8 local_138;
  ulong local_130;
  ComputationGraph *local_128;
  Expression local_120;
  long local_110;
  Expression local_108;
  undefined1 local_f8 [8];
  ulong local_f0;
  Expression local_e8;
  Expression local_d8;
  long local_c8;
  undefined1 local_c0 [8];
  size_type local_b8;
  initializer_list<cnn::expr::Expression> local_b0;
  Expression local_a0;
  FastLSTMBuilder *local_90;
  long *local_88;
  long *local_80;
  long local_78;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_70;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_68;
  long local_60;
  ulong local_58;
  initializer_list<cnn::expr::Expression> local_50;
  Expression local_40;
  
  lVar7 = CONCAT44(in_register_00000034,prev);
  local_13c = (uint)x;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_190,
             (ulong)*(uint *)(lVar7 + 0xc0),(allocator_type *)&local_e8);
  local_68 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar7 + 0x58);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_68,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      local_190);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             local_190);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_190,
             (ulong)*(uint *)(lVar7 + 0xc0),(allocator_type *)&local_e8);
  local_70 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar7 + 0x70);
  local_90 = this;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_70,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      local_190);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             local_190);
  local_c8 = *(long *)(lVar7 + 0x60);
  local_110 = *(long *)(lVar7 + 0x78);
  local_80 = (long *)(lVar7 + 0x90);
  lVar6 = 0;
  lVar9 = 0;
  local_88 = (long *)(lVar7 + 0xa8);
  local_58 = 0;
  local_78 = (ulong)local_13c * 0x18;
  local_170 = (ComputationGraph *)*in_RCX;
  VVar8.t = *(uint *)(in_RCX + 1);
  local_60 = lVar7;
  do {
    if (*(uint *)(local_60 + 0xc0) <= local_58) {
      lVar6 = *(long *)(local_c8 + -0x10);
      (local_90->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar6 + -0x10);
      (local_90->super_RNNBuilder).cur.t = *(int *)(lVar6 + -8);
      EVar12._8_8_ = lVar6;
      EVar12.pg = (ComputationGraph *)local_90;
      return EVar12;
    }
    lVar7 = *(long *)(local_60 + 0x40);
    bVar10 = (int)local_13c < 0;
    local_e8.pg = (ComputationGraph *)0x0;
    local_e8.i.t = 0;
    bVar1 = *(byte *)(local_60 + 0x88);
    if ((int)local_13c < 0) {
      plVar4 = local_88;
      plVar5 = local_80;
      if ((bVar1 & 1) != 0) goto LAB_001e8d17;
      local_130 = 0;
      local_138 = 0;
    }
    else {
      plVar4 = (long *)(*(long *)local_70 + local_78);
      plVar5 = (long *)(*(long *)local_68 + local_78);
LAB_001e8d17:
      local_e8.pg = *(ComputationGraph **)(*plVar4 + lVar9);
      local_138 = *(undefined8 *)(*plVar5 + lVar9);
      local_130 = (ulong)*(uint *)(*plVar5 + 8 + lVar9);
      local_e8.i.t = *(uint *)(*plVar4 + 8 + lVar9);
    }
    local_a0.pg = (ComputationGraph *)0x0;
    local_a0.i.t = 0;
    local_198 = lVar7;
    local_168 = VVar8.t;
    local_128 = local_170;
    if (bVar10 && (bVar1 & 1) == 0) {
      puVar2 = *(undefined8 **)(lVar7 + lVar6);
      local_190._0_8_ = puVar2[6];
      local_190._8_4_ = *(undefined4 *)(puVar2 + 7);
      local_180 = (pointer)*puVar2;
      local_b0._M_array = (iterator)local_190;
      local_178 = *(undefined4 *)(puVar2 + 1);
      local_b0._M_len = 3;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_120,&local_b0);
    }
    else {
      puVar2 = *(undefined8 **)(lVar7 + lVar6);
      local_190._0_8_ = puVar2[6];
      local_190._8_4_ = *(undefined4 *)(puVar2 + 7);
      local_180 = (pointer)*puVar2;
      local_178 = *(undefined4 *)(puVar2 + 1);
      local_160 = (ExecutionEngine *)puVar2[2];
      local_f8 = (undefined1  [8])local_190;
      local_158 = *(undefined4 *)(puVar2 + 3);
      local_f0 = 5;
      local_150 = local_138;
      local_148 = (undefined4)local_130;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_b0,(initializer_list<cnn::expr::Expression> *)local_f8);
      expr::cwise_multiply
                ((expr *)&local_d8,(Expression *)(*(long *)(lVar7 + lVar6) + 0x20),&local_e8);
      expr::operator+((expr *)&local_120,(Expression *)&local_b0,&local_d8);
    }
    local_a0.pg = local_120.pg;
    local_a0.i.t = local_120.i.t;
    expr::logistic((expr *)&local_120,&local_a0);
    dVar11 = SUB648(ZEXT464(0x3f800000),0);
    expr::operator-((expr *)&local_b0,1.0,&local_120);
    local_f8 = (undefined1  [8])0x0;
    local_f0 = local_f0 & 0xffffffff00000000;
    if (bVar10 && (bVar1 & 1) == 0) {
      lVar7 = *(long *)(local_198 + lVar6);
      local_190._0_8_ = *(undefined8 *)(lVar7 + 0xa0);
      local_190._8_4_ = *(uint *)(lVar7 + 0xa8);
      local_180 = *(pointer *)(lVar7 + 0x80);
      local_178 = *(undefined4 *)(lVar7 + 0x88);
      local_1a0 = 3;
    }
    else {
      lVar7 = *(long *)(local_198 + lVar6);
      local_190._0_8_ = *(undefined8 *)(lVar7 + 0xa0);
      local_190._8_4_ = *(uint *)(lVar7 + 0xa8);
      local_180 = *(pointer *)(lVar7 + 0x80);
      local_178 = *(undefined4 *)(lVar7 + 0x88);
      local_160 = *(ExecutionEngine **)(lVar7 + 0x90);
      local_158 = *(undefined4 *)(lVar7 + 0x98);
      local_1a0 = 5;
      local_150 = local_138;
      local_148 = (undefined4)local_130;
    }
    local_1a8 = (undefined1  [8])local_190;
    local_170 = local_128;
    local_168 = VVar8.t;
    expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&local_d8,(initializer_list<cnn::expr::Expression> *)local_1a8);
    local_f8 = (undefined1  [8])local_d8.pg;
    local_f0 = CONCAT44(local_f0._4_4_,local_d8.i.t);
    dVar11 = expr::tanh((expr *)&local_d8,dVar11);
    if (bVar10 && (bVar1 & 1) == 0) {
      expr::cwise_multiply((expr *)local_190,&local_120,&local_d8);
      lVar7 = *(long *)(local_110 + -0x18);
      *(undefined8 *)(lVar7 + lVar9) = local_190._0_8_;
      *(undefined4 *)(lVar7 + 8 + lVar9) = local_190._8_4_;
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = local_1a0 & 0xffffffff00000000;
      lVar7 = *(long *)(local_198 + lVar6);
      local_190._0_8_ = *(undefined8 *)(lVar7 + 0x70);
      local_190._8_4_ = *(uint *)(lVar7 + 0x78);
      local_180 = *(pointer *)(lVar7 + 0x40);
      local_178 = *(undefined4 *)(lVar7 + 0x48);
      local_b8 = 3;
      local_170 = local_128;
      local_168 = VVar8.t;
      local_c0 = (undefined1  [8])local_190;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_108,(initializer_list<cnn::expr::Expression> *)local_c0);
    }
    else {
      expr::cwise_multiply((expr *)local_190,&local_120,&local_d8);
      expr::cwise_multiply((expr *)local_1a8,(Expression *)&local_b0,&local_e8);
      expr::operator+((expr *)&local_108,(Expression *)local_1a8,(Expression *)local_190);
      lVar3 = local_198;
      lVar7 = *(long *)(local_110 + -0x18);
      *(ComputationGraph **)(lVar7 + lVar9) = local_108.pg;
      *(uint *)(lVar7 + 8 + lVar9) = local_108.i.t;
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = local_1a0 & 0xffffffff00000000;
      lVar7 = *(long *)(local_198 + lVar6);
      local_190._0_8_ = *(undefined8 *)(lVar7 + 0x70);
      local_190._8_4_ = *(uint *)(lVar7 + 0x78);
      local_180 = *(pointer *)(lVar7 + 0x40);
      local_178 = *(undefined4 *)(lVar7 + 0x48);
      local_170 = local_128;
      local_160 = *(ExecutionEngine **)(lVar7 + 0x50);
      local_158 = *(undefined4 *)(lVar7 + 0x58);
      local_50._M_len = 5;
      local_150 = local_138;
      local_148 = (undefined4)local_130;
      local_168 = VVar8.t;
      local_50._M_array = (Expression *)local_190;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)local_c0,&local_50);
      expr::cwise_multiply
                ((expr *)&local_40,(Expression *)(*(long *)(lVar3 + lVar6) + 0x60),
                 (Expression *)(*(long *)(local_110 + -0x18) + lVar9));
      expr::operator+((expr *)&local_108,(Expression *)local_c0,&local_40);
    }
    local_1a8 = (undefined1  [8])local_108.pg;
    local_1a0 = CONCAT44(local_1a0._4_4_,local_108.i.t);
    expr::logistic((expr *)local_190,(Expression *)local_1a8);
    expr::tanh((expr *)&local_108,dVar11);
    expr::cwise_multiply((expr *)local_c0,(Expression *)local_190,&local_108);
    lVar6 = lVar6 + 0x18;
    lVar7 = *(long *)(local_c8 + -0x18);
    local_58 = local_58 + 1;
    *(undefined1 (*) [8])(lVar7 + lVar9) = local_c0;
    *(uint *)(lVar7 + 8 + lVar9) = local_b8._0_4_;
    lVar9 = lVar9 + 0x10;
    local_170 = (ComputationGraph *)local_c0;
    VVar8.t = local_b8._0_4_;
  } while( true );
}

Assistant:

Expression FastLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state) {
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + cwise_multiply(vars[C2I], i_c_tm1);
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1}) +
              cwise_multiply(vars[C2I], i_c_tm1);
    } else {
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    }
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state) {
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + cwise_multiply(vars[C2O], ct[i]);
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1}) +
              cwise_multiply(vars[C2O], ct[i]);
    }
    else {
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    }
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
  }
  return ht.back();
}